

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O2

ElementPtr __thiscall Rml::Element::RemoveChild(Element *this,Element *child)

{
  Context *this_00;
  Element *pEVar1;
  Element *in_RDX;
  ulong uVar2;
  Element *pEVar3;
  int i;
  uint uVar4;
  const_iterator __position;
  
  __position._M_current =
       (child->children).
       super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  uVar2 = 0;
  while( true ) {
    if (__position._M_current ==
        (child->children).
        super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)0x0;
      return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
             (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
    }
    if (((__position._M_current)->_M_t).
        super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
        super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
        super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl == in_RDX) break;
    uVar2 = uVar2 + 1;
    __position._M_current = __position._M_current + 1;
  }
  pEVar3 = in_RDX;
  for (uVar4 = 0; (pEVar3 != (Element *)0x0 && (uVar4 < 3)); uVar4 = uVar4 + 1) {
    (*(pEVar3->super_ScriptInterface).super_Releasable._vptr_Releasable[0x14])(pEVar3);
    pEVar3 = pEVar3->parent;
  }
  if ((ulong)(((long)(child->children).
                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(child->children).
                     super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) -
             (long)child->num_non_dom_children) <= uVar2) {
    child->num_non_dom_children = child->num_non_dom_children + -1;
  }
  pEVar3 = ((__position._M_current)->_M_t).
           super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>._M_t.
           super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
           super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl;
  (this->super_ScriptInterface).super_Releasable._vptr_Releasable = (_func_int **)pEVar3;
  ((__position._M_current)->_M_t).super___uniq_ptr_impl<Rml::Element,_Rml::Releaser<Rml::Element>_>.
  _M_t.super__Tuple_impl<0UL,_Rml::Element_*,_Rml::Releaser<Rml::Element>_>.
  super__Head_base<0UL,_Rml::Element_*,_false>._M_head_impl = (Element *)0x0;
  ::std::
  vector<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
  ::erase(&child->children,__position);
  if (child->focus == in_RDX) {
    child->focus = (Element *)0x0;
    this_00 = GetContext(child);
    if (this_00 != (Context *)0x0) {
      for (pEVar1 = Context::GetFocusElement(this_00); pEVar1 != (Element *)0x0;
          pEVar1 = pEVar1->parent) {
        if (pEVar1 == in_RDX) {
          Focus(child,false);
          break;
        }
      }
    }
  }
  SetParent(pEVar3,(Element *)0x0);
  (*(child->super_ScriptInterface).super_Releasable._vptr_Releasable[0x15])(child);
  DirtyStackingContext(child);
  child->field_0x17 = child->field_0x17 | 2;
  return (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)
         (__uniq_ptr_data<Rml::Element,_Rml::Releaser<Rml::Element>,_true,_true>)this;
}

Assistant:

ElementPtr Element::RemoveChild(Element* child)
{
	size_t child_index = 0;

	for (auto itr = children.begin(); itr != children.end(); ++itr)
	{
		// Add the element to the delete list
		if (itr->get() == child)
		{
			Element* ancestor = child;
			for (int i = 0; i <= ChildNotifyLevels && ancestor; i++, ancestor = ancestor->GetParentNode())
				ancestor->OnChildRemove(child);

			if (child_index >= children.size() - num_non_dom_children)
				num_non_dom_children--;

			ElementPtr detached_child = std::move(*itr);
			children.erase(itr);

			// Remove the child element as the focused child of this element.
			if (child == focus)
			{
				focus = nullptr;

				// If this child (or a descendant of this child) is the context's currently
				// focused element, set the focus to us instead.
				if (Context* context = GetContext())
				{
					Element* focus_element = context->GetFocusElement();
					while (focus_element)
					{
						if (focus_element == child)
						{
							Focus();
							break;
						}

						focus_element = focus_element->GetParentNode();
					}
				}
			}

			detached_child->SetParent(nullptr);

			DirtyLayout();
			DirtyStackingContext();
			DirtyDefinition(DirtyNodes::Self);

			return detached_child;
		}

		child_index++;
	}

	return nullptr;
}